

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void inner_update_proximal(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = x * d->update;
  fVar3 = fVar1 * fVar1 + wref[2];
  if (fVar3 < 0.0) {
    fVar4 = sqrtf(fVar3);
  }
  else {
    fVar4 = SQRT(fVar3);
  }
  fVar2 = wref[2];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (fVar1 - ((fVar4 - fVar2) / d->ftrl_alpha) * *wref) + wref[1];
  fVar1 = 0.0;
  wref[1] = fVar2;
  wref[2] = fVar3;
  fVar3 = fVar2 * *(float *)(&DAT_00238850 + (ulong)(fVar2 < 0.0) * 4);
  if (d->l1_lambda < fVar3) {
    fVar1 = (d->l1_lambda - fVar3) *
            *(float *)(&DAT_00238850 + (ulong)(fVar2 < 0.0) * 4) *
            (1.0 / ((fVar4 + d->ftrl_beta) / d->ftrl_alpha + d->l2_lambda));
  }
  *wref = fVar1;
  return;
}

Assistant:

void inner_update_proximal(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float gradient = d.update * x;
  float ng2 = w[W_G2] + gradient * gradient;
  float sqrt_ng2 = sqrtf(ng2);
  float sqrt_wW_G2 = sqrtf(w[W_G2]);
  float sigma = (sqrt_ng2 - sqrt_wW_G2) / d.ftrl_alpha;
  w[W_ZT] += gradient - sigma * w[W_XT];
  w[W_G2] = ng2;
  sqrt_wW_G2 = sqrt_ng2;
  float flag = sign(w[W_ZT]);
  float fabs_zt = w[W_ZT] * flag;
  if (fabs_zt <= d.l1_lambda)
    w[W_XT] = 0.;
  else
  {
    float step = 1 / (d.l2_lambda + (d.ftrl_beta + sqrt_wW_G2) / d.ftrl_alpha);
    w[W_XT] = step * flag * (d.l1_lambda - fabs_zt);
  }
}